

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3PagerFlush(Pager *pPager)

{
  PgHdr *pPVar1;
  PgHdr *pNext;
  PgHdr *pList;
  int rc;
  Pager *pPager_local;
  
  pList._4_4_ = pPager->errCode;
  if (pPager->memDb == '\0') {
    pPVar1 = sqlite3PcacheDirtyList(pPager->pPCache);
    while (pNext = pPVar1, pList._4_4_ == 0 && pNext != (PgHdr *)0x0) {
      pPVar1 = pNext->pDirty;
      if (pNext->nRef == 0) {
        pList._4_4_ = pagerStress(pPager,pNext);
      }
    }
  }
  return pList._4_4_;
}

Assistant:

SQLITE_PRIVATE int sqlite3PagerFlush(Pager *pPager){
  int rc = pPager->errCode;
  if( !MEMDB ){
    PgHdr *pList = sqlite3PcacheDirtyList(pPager->pPCache);
    assert( assert_pager_state(pPager) );
    while( rc==SQLITE_OK && pList ){
      PgHdr *pNext = pList->pDirty;
      if( pList->nRef==0 ){
        rc = pagerStress((void*)pPager, pList);
      }
      pList = pNext;
    }
  }

  return rc;
}